

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

word If_Dec6MinimumBase(word uTruth,int *pSupp,int nVarsAll,int *pnVars)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int v;
  int local_3c;
  uint local_38;
  
  if (6 < nVarsAll) {
    __assert_fail("nVarsAll <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec07.c"
                  ,0x203,"word If_Dec6MinimumBase(word, int *, int, int *)");
  }
  uVar5 = 0;
  uVar3 = (ulong)(uint)nVarsAll;
  if (nVarsAll < 1) {
    uVar3 = uVar5;
  }
  local_3c = 0;
  uVar6 = 0;
  for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    iVar1 = If_Dec6HasVar(uTruth,(uint)uVar5);
    if (iVar1 != 0) {
      if (pSupp != (int *)0x0) {
        pSupp[local_3c] = pSupp[uVar5];
      }
      uVar6 = uVar6 | 1 << ((uint)uVar5 & 0x1f);
      local_3c = local_3c + 1;
    }
  }
  if (pnVars != (int *)0x0) {
    *pnVars = local_3c;
  }
  if ((uVar6 + 1 & uVar6) != 0) {
    iVar1 = -1;
    iVar2 = 0;
    for (uVar4 = 0; local_38 = (uint)uVar3, uVar4 != local_38; uVar4 = uVar4 + 1) {
      v = iVar1;
      if ((uVar6 >> (uVar4 & 0x1f) & 1) != 0) {
        for (; iVar2 < v + 1; v = v + -1) {
          uTruth = If_Dec6SwapAdjacent(uTruth,v);
        }
        iVar2 = iVar2 + 1;
      }
      iVar1 = iVar1 + 1;
    }
    if (iVar2 != local_3c) {
      __assert_fail("Var == nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec07.c"
                    ,0x1fd,"word If_Dec6TruthShrink(word, int, int, unsigned int)");
    }
  }
  return uTruth;
}

Assistant:

word If_Dec6MinimumBase( word uTruth, int * pSupp, int nVarsAll, int * pnVars )
{
    int v, iVar = 0, uSupp = 0;
    assert( nVarsAll <= 6 );
    for ( v = 0; v < nVarsAll; v++ )
        if ( If_Dec6HasVar( uTruth, v ) )
        {
            uSupp |= (1 << v);
            if ( pSupp )
                pSupp[iVar] = pSupp[v];
            iVar++;
        }
    if ( pnVars )
        *pnVars = iVar;
    if ( If_DecSuppIsMinBase( uSupp ) )
        return uTruth;
    return If_Dec6TruthShrink( uTruth, iVar, nVarsAll, uSupp );
}